

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_entry
          (BinBinaryReader *this,Hash *entryKeyHash,Embed *entry)

{
  uint *puVar1;
  BinaryReader *this_00;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  ssize_t sVar5;
  reference pvVar6;
  long lVar7;
  size_t in_RCX;
  uint *pos;
  void *__buf;
  void *__buf_00;
  char *pcVar8;
  char *msg;
  ulong uVar9;
  long lVar10;
  Type type;
  Type local_49;
  ulong local_48;
  uint *local_40;
  char *local_38;
  
  pos = (uint *)(this->reader).cur_;
  puVar1 = pos + 1;
  if ((this->reader).cap_ < puVar1) {
    pcVar8 = "reader.read(entryLength)";
  }
  else {
    this_00 = &this->reader;
    uVar2 = *pos;
    (this->reader).cur_ = (char *)puVar1;
    local_38 = (this->reader).beg_;
    sVar5 = BinaryReader::read(this_00,(int)entryKeyHash,pos,in_RCX);
    if ((char)sVar5 == '\0') {
      pcVar8 = "reader.read(entryKeyHash.value)";
      pos = puVar1;
    }
    else {
      pos = (uint *)(this->reader).cur_;
      local_40 = puVar1;
      if ((ushort *)((long)pos + 2U) <= (this->reader).cap_) {
        uVar9 = (ulong)(ushort)*pos;
        (this->reader).cur_ = (char *)((long)pos + 2U);
        local_48 = (ulong)uVar2;
        do {
          bVar3 = uVar9 == 0;
          uVar9 = uVar9 - 1;
          if (bVar3) {
            pcVar8 = (this->reader).cur_;
            lVar10 = (long)pcVar8 - (long)(this->reader).beg_;
            lVar7 = (long)local_40 + (local_48 - (long)local_38);
            if (lVar10 != lVar7) {
              bVar3 = fail_msg(this,"reader.position() == position + entryLength",pcVar8);
              in_RCX = (size_t)bVar3;
            }
            bVar4 = lVar10 == lVar7 | (byte)in_RCX;
            goto LAB_00111c0a;
          }
          pvVar6 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                             (&entry->items);
          local_49 = NONE;
          pcVar8 = (this->reader).cur_;
          sVar5 = BinaryReader::read(this_00,(int)pvVar6,__buf,in_RCX);
          if ((char)sVar5 == '\0') {
            msg = "reader.read(name)";
            goto LAB_00111bff;
          }
          pcVar8 = (this->reader).cur_;
          sVar5 = BinaryReader::read(this_00,(int)&local_49,__buf_00,in_RCX);
          if ((char)sVar5 == '\0') {
            msg = "reader.read(type)";
            goto LAB_00111bff;
          }
          pcVar8 = (this->reader).cur_;
          bVar3 = read_value_of(this,&pvVar6->value,local_49);
        } while (bVar3);
        msg = "read_value_of(item, type)";
LAB_00111bff:
        bVar4 = fail_msg(this,msg,pcVar8);
LAB_00111c0a:
        return (bool)(bVar4 & 1);
      }
      pcVar8 = "reader.read(count)";
    }
  }
  bVar3 = fail_msg(this,pcVar8,(char *)pos);
  return bVar3;
}

Assistant:

bool read_entry(Hash& entryKeyHash, Embed& entry) noexcept {
            uint32_t entryLength = 0;
            uint16_t count = 0;
            bin_assert(reader.read(entryLength));
            size_t position = reader.position();
            bin_assert(reader.read(entryKeyHash.value));
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [name, item] = entry.items.emplace_back();
                Type type = {};
                bin_assert(reader.read(name));
                bin_assert(reader.read(type));
                bin_assert(read_value_of(item, type));
            }
            bin_assert(reader.position() == position + entryLength);
            return true;
        }